

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O1

void __thiscall
QWidgetRepaintManager::moveStaticWidgets(QWidgetRepaintManager *this,QWidget *reparented)

{
  bool bVar1;
  QWidget *pQVar2;
  int iVar3;
  long lVar4;
  QWidgetRepaintManager *this_00;
  
  pQVar2 = QWidget::window(*(QWidget **)(*(long *)&reparented->field_0x8 + 8));
  lVar4 = *(long *)(*(long *)&pQVar2->field_0x8 + 0x78);
  if (lVar4 == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = *(long *)(lVar4 + 8);
  }
  if (lVar4 == 0) {
    this_00 = (QWidgetRepaintManager *)0x0;
  }
  else {
    this_00 = *(QWidgetRepaintManager **)(lVar4 + 8);
  }
  if ((this_00 != this) && (*(long *)(this + 0x78) != 0)) {
    lVar4 = 0;
    iVar3 = 0;
    do {
      pQVar2 = *(QWidget **)(*(long *)(this + 0x70) + lVar4 * 8);
      if (pQVar2 == reparented) {
LAB_0031dabb:
        QList<QWidget_*>::removeAt((QList<QWidget_*> *)(this + 0x68),lVar4);
        if (this_00 != (QWidgetRepaintManager *)0x0) {
          addStaticWidget(this_00,pQVar2);
        }
      }
      else {
        bVar1 = QWidget::isAncestorOf(reparented,pQVar2);
        if (bVar1) goto LAB_0031dabb;
        iVar3 = iVar3 + 1;
      }
      lVar4 = (long)iVar3;
    } while (lVar4 < *(long *)(this + 0x78));
  }
  return;
}

Assistant:

void QWidgetRepaintManager::moveStaticWidgets(QWidget *reparented)
{
    Q_ASSERT(reparented);
    QWidgetRepaintManager *newPaintManager = reparented->d_func()->maybeRepaintManager();
    if (newPaintManager == this)
        return;

    int i = 0;
    while (i < staticWidgets.size()) {
        QWidget *w = staticWidgets.at(i);
        if (reparented == w || reparented->isAncestorOf(w)) {
            staticWidgets.removeAt(i);
            if (newPaintManager)
                newPaintManager->addStaticWidget(w);
        } else {
            ++i;
        }
    }
}